

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strcase.c
# Opt level: O1

int curl_strequal(char *first,char *second)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  byte bVar4;
  bool bVar5;
  
  if (second == (char *)0x0 || first == (char *)0x0) {
    bVar5 = first == (char *)0x0 && second == (char *)0x0;
  }
  else {
    bVar2 = *first;
    bVar5 = bVar2 == 0;
    if ((!bVar5) && (bVar4 = *second, bVar4 != 0)) {
      pbVar3 = (byte *)(first + 1);
      pbVar1 = (byte *)(second + 1);
      do {
        second = (char *)pbVar1;
        if (""[bVar2] != ""[bVar4]) {
          bVar5 = false;
          goto LAB_0015ad9d;
        }
        bVar2 = *pbVar3;
        bVar5 = bVar2 == 0;
        if (bVar5) break;
        bVar4 = *second;
        pbVar3 = pbVar3 + 1;
        pbVar1 = (byte *)second + 1;
      } while (bVar4 != 0);
    }
    bVar5 = (bool)(*second != 0U ^ bVar5);
  }
LAB_0015ad9d:
  return (int)bVar5;
}

Assistant:

int curl_strequal(const char *first, const char *second)
{
  if(first && second)
    /* both pointers point to something then compare them */
    return casecompare(first, second);

  /* if both pointers are NULL then treat them as equal */
  return (NULL == first && NULL == second);
}